

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int execSql(sqlite3 *db,char **pzErrMsg,char *zSql)

{
  char *pz;
  char **db_00;
  int iVar1;
  uchar *__s1;
  char *zNew;
  char *zSubSql;
  sqlite3_stmt *psStack_30;
  int rc;
  sqlite3_stmt *pStmt;
  char *zSql_local;
  char **pzErrMsg_local;
  sqlite3 *db_local;
  
  pStmt = (sqlite3_stmt *)zSql;
  zSql_local = (char *)pzErrMsg;
  pzErrMsg_local = (char **)db;
  db_local._4_4_ = sqlite3_prepare_v2(db,zSql,-1,&stack0xffffffffffffffd0,(char **)0x0);
  if (db_local._4_4_ == 0) {
    do {
      zSubSql._4_4_ = sqlite3_step(psStack_30);
      if (zSubSql._4_4_ != 100) break;
      __s1 = sqlite3_column_text(psStack_30,0);
    } while ((__s1 == (uchar *)0x0) ||
            (((iVar1 = strncmp((char *)__s1,"CRE",3), iVar1 != 0 &&
              (iVar1 = strncmp((char *)__s1,"INS",3), iVar1 != 0)) ||
             (zSubSql._4_4_ = execSql((sqlite3 *)pzErrMsg_local,(char **)zSql_local,(char *)__s1),
             zSubSql._4_4_ == 0))));
    db_00 = pzErrMsg_local;
    pz = zSql_local;
    if (zSubSql._4_4_ == 0x65) {
      zSubSql._4_4_ = 0;
    }
    if (zSubSql._4_4_ != 0) {
      zNew = sqlite3_errmsg((sqlite3 *)pzErrMsg_local);
      sqlite3SetString((char **)pz,(sqlite3 *)db_00,zNew);
    }
    sqlite3_finalize(psStack_30);
    db_local._4_4_ = zSubSql._4_4_;
  }
  return db_local._4_4_;
}

Assistant:

static int execSql(sqlite3 *db, char **pzErrMsg, const char *zSql){
  sqlite3_stmt *pStmt;
  int rc;

  /* printf("SQL: [%s]\n", zSql); fflush(stdout); */
  rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
  if( rc!=SQLITE_OK ) return rc;
  while( SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
    const char *zSubSql = (const char*)sqlite3_column_text(pStmt,0);
    assert( sqlite3_strnicmp(zSql,"SELECT",6)==0 );
    /* The secondary SQL must be one of CREATE TABLE, CREATE INDEX,
    ** or INSERT.  Historically there have been attacks that first
    ** corrupt the sqlite_master.sql field with other kinds of statements
    ** then run VACUUM to get those statements to execute at inappropriate
    ** times. */
    if( zSubSql
     && (strncmp(zSubSql,"CRE",3)==0 || strncmp(zSubSql,"INS",3)==0)
    ){
      rc = execSql(db, pzErrMsg, zSubSql);
      if( rc!=SQLITE_OK ) break;
    }
  }
  assert( rc!=SQLITE_ROW );
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  if( rc ){
    sqlite3SetString(pzErrMsg, db, sqlite3_errmsg(db));
  }
  (void)sqlite3_finalize(pStmt);
  return rc;
}